

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * replaceArgEscapes(QString *__return_storage_ptr__,QStringView s,ArgEscapeData *d,
                           qsizetype field_width,QStringView arg,QStringView larg,QChar fillChar)

{
  size_t sVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  QChar *pQVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QStringView *pQVar10;
  long lVar11;
  int iVar12;
  storage_type_conflict *psVar13;
  QChar *pQVar14;
  qsizetype qVar15;
  storage_type_conflict *psVar16;
  qsizetype qVar17;
  long lVar18;
  storage_type_conflict *psVar19;
  size_t __n;
  long in_FS_OFFSET;
  QChar fillChar_local;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  lVar18 = -field_width;
  if (0 < field_width) {
    lVar18 = field_width;
  }
  lVar11 = d->escape_len;
  lVar4 = d->occurrences;
  lVar5 = d->locale_occurrences;
  qVar17 = arg.m_size;
  if (arg.m_size < lVar18) {
    qVar17 = lVar18;
  }
  qVar15 = larg.m_size;
  if (larg.m_size < lVar18) {
    qVar15 = lVar18;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  fillChar_local = fillChar;
  QString::QString(__return_storage_ptr__,
                   qVar15 * lVar5 + qVar17 * (lVar4 - lVar5) + (s.m_size - lVar11),
                   (Initialization)lVar5);
  pQVar6 = (QChar *)(__return_storage_ptr__->d).ptr;
  pQVar14 = (QChar *)L"";
  if (pQVar6 != (QChar *)0x0) {
    pQVar14 = pQVar6;
  }
  psVar13 = s.m_data + s.m_size;
  lVar11 = 0;
  iVar7 = -1;
  psVar16 = s.m_data;
  while (psVar16 != psVar13) {
    sVar1 = 0;
    do {
      __n = sVar1;
      sVar1 = __n + 2;
    } while (*(short *)((long)psVar16 + __n) != 0x25);
    sVar2 = *(short *)((long)psVar16 + sVar1);
    psVar19 = (storage_type_conflict *)((long)psVar16 + sVar1);
    if (sVar2 == 0x4c) {
      psVar19 = (short *)((long)psVar16 + sVar1) + 1;
    }
    iVar8 = (ushort)*psVar19 - 0x30;
    if (9 < (ushort)((ushort)*psVar19 - 0x30)) {
      iVar8 = iVar7;
    }
    iVar9 = iVar7;
    if ((iVar8 != -1) && (iVar9 = iVar8, psVar19 + 1 != psVar13)) {
      iVar12 = (ushort)psVar19[1] - 0x30;
      if (9 < (ushort)((ushort)psVar19[1] - 0x30)) {
        iVar12 = iVar7;
      }
      if (iVar12 != -1) {
        psVar19 = psVar19 + 1;
        iVar9 = iVar8 * 10 + iVar12;
      }
    }
    if (iVar9 == d->min_escape) {
      memcpy(pQVar14,psVar16,__n);
      pQVar10 = &arg;
      if (sVar2 == 0x4c) {
        pQVar10 = &larg;
      }
      psVar16 = pQVar10->m_data;
      lVar4 = pQVar10->m_size;
      pQVar14 = (QChar *)((long)&pQVar14->ucs + __n);
      if (0 < field_width) {
        pQVar14 = std::__fill_n_a<QChar*,long_long,QChar>(pQVar14,lVar18 - lVar4,&fillChar_local);
      }
      if (lVar4 != 0) {
        memcpy(pQVar14,psVar16,lVar4 * 2);
      }
      pQVar14 = pQVar14 + lVar4;
      if (field_width < 0) {
        pQVar14 = std::__fill_n_a<QChar*,long_long,QChar>(pQVar14,lVar18 - lVar4,&fillChar_local);
      }
      psVar16 = psVar19 + 1;
      lVar11 = lVar11 + 1;
      if (lVar11 == d->occurrences) {
        memcpy(pQVar14,psVar16,(long)psVar13 - (long)psVar16);
        pQVar14 = (QChar *)((long)pQVar14 + ((long)psVar13 - (long)psVar16));
        psVar16 = psVar13;
      }
    }
    else {
      memcpy(pQVar14,psVar16,(long)psVar19 - (long)psVar16);
      pQVar14 = (QChar *)((long)pQVar14 + ((long)psVar19 - (long)psVar16));
      psVar16 = psVar19;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString replaceArgEscapes(QStringView s, const ArgEscapeData &d, qsizetype field_width,
                                 QStringView arg, QStringView larg, QChar fillChar)
{
    // Negative field-width for right-padding, positive for left-padding:
    const qsizetype abs_field_width = qAbs(field_width);
    const qsizetype result_len =
            s.size() - d.escape_len
            + (d.occurrences - d.locale_occurrences) * qMax(abs_field_width, arg.size())
            + d.locale_occurrences * qMax(abs_field_width, larg.size());

    QString result(result_len, Qt::Uninitialized);
    QChar *rc = const_cast<QChar *>(result.unicode());
    QChar *const result_end = rc + result_len;
    qsizetype repl_cnt = 0;

    const QChar *c = s.begin();
    const QChar *const uc_end = s.end();
    while (c != uc_end) {
        Q_ASSERT(d.occurrences > repl_cnt);
        /* We don't have to check increments of c against uc_end because, as
           long as d.occurrences > repl_cnt, we KNOW there are valid escape
           sequences remaining. */

        const QChar *text_start = c;
        while (c->unicode() != '%')
            ++c;

        const QChar *escape_start = c++;
        const bool localize = c->unicode() == 'L';
        if (localize)
            ++c;

        int escape = qArgDigitValue(*c);
        if (escape != -1 && c + 1 != uc_end) {
            const int digit = qArgDigitValue(c[1]);
            if (digit != -1) {
                ++c;
                escape = 10 * escape + digit;
            }
        }

        if (escape != d.min_escape) {
            memcpy(rc, text_start, (c - text_start) * sizeof(QChar));
            rc += c - text_start;
        } else {
            ++c;

            memcpy(rc, text_start, (escape_start - text_start) * sizeof(QChar));
            rc += escape_start - text_start;

            const QStringView use = localize ? larg : arg;
            const qsizetype pad_chars = abs_field_width - use.size();
            // (If negative, relevant loops are no-ops: no need to check.)

            if (field_width > 0) { // left padded
                rc = std::fill_n(rc, pad_chars, fillChar);
            }

            if (use.size())
                memcpy(rc, use.data(), use.size() * sizeof(QChar));
            rc += use.size();

            if (field_width < 0) { // right padded
                rc = std::fill_n(rc, pad_chars, fillChar);
            }

            if (++repl_cnt == d.occurrences) {
                memcpy(rc, c, (uc_end - c) * sizeof(QChar));
                rc += uc_end - c;
                Q_ASSERT(rc == result_end);
                c = uc_end;
            }
        }
    }
    Q_ASSERT(rc == result_end);

    return result;
}